

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O1

bool tinyusdz::io::ReadWholeFile
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,string *err,
               string *filepath,size_t filesize_max,void *userdata)

{
  pointer puVar1;
  long *plVar2;
  ulong __new_size;
  long *plVar3;
  size_type *psVar4;
  bool bVar5;
  char *__lhs;
  ifstream f;
  long *local_338;
  long local_328;
  long lStack_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(filepath->_M_dataplus)._M_p,_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    std::istream::peek();
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
      std::istream::seekg((long)local_238,_S_beg);
      __new_size = std::istream::tellg();
      std::istream::seekg((long)local_238,_S_beg);
      if ((long)__new_size < 0) {
        if (err != (string *)0x0) {
          std::operator+(&local_318,"Invalid file size : ",filepath);
          goto LAB_0018effc;
        }
      }
      else if (__new_size == 0x7fffffffffffffff) {
        if (err != (string *)0x0) {
          __lhs = "Invalid File(Pipe or special device?) : ";
          goto LAB_0018efe5;
        }
      }
      else if (__new_size == 0) {
        if (err != (string *)0x0) {
          __lhs = "File is empty : ";
          goto LAB_0018efe5;
        }
      }
      else if (filesize_max < __new_size && filesize_max != 0) {
        if (err != (string *)0x0) {
          std::operator+(&local_278,"File size is too large : ",filepath);
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_278);
          psVar4 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar4) {
            local_2f8.field_2._M_allocated_capacity = *psVar4;
            local_2f8.field_2._8_8_ = plVar2[3];
            local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          }
          else {
            local_2f8.field_2._M_allocated_capacity = *psVar4;
            local_2f8._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_2f8._M_string_length = plVar2[1];
          *plVar2 = (long)psVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::to_string(&local_298,__new_size);
          std::operator+(&local_258,&local_2f8,&local_298);
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_258);
          psVar4 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar4) {
            local_2d8.field_2._M_allocated_capacity = *psVar4;
            local_2d8.field_2._8_8_ = plVar2[3];
            local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          }
          else {
            local_2d8.field_2._M_allocated_capacity = *psVar4;
            local_2d8._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_2d8._M_string_length = plVar2[1];
          *plVar2 = (long)psVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::to_string(&local_2b8,filesize_max);
          std::operator+(&local_318,&local_2d8,&local_2b8);
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_318);
          plVar3 = plVar2 + 2;
          if ((long *)*plVar2 == plVar3) {
            local_328 = *plVar3;
            lStack_320 = plVar2[3];
            local_338 = &local_328;
          }
          else {
            local_328 = *plVar3;
            local_338 = (long *)*plVar2;
          }
          *plVar2 = (long)plVar3;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::string::_M_append((char *)err,(ulong)local_338);
          if (local_338 != &local_328) {
            operator_delete(local_338,local_328 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) goto LAB_0018f083;
        }
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out,__new_size);
        puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish == puVar1) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        std::istream::read((char *)local_238,(long)puVar1);
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
          bVar5 = true;
          goto LAB_0018f08d;
        }
        if (err != (string *)0x0) {
          __lhs = "Failed to read file: ";
          goto LAB_0018efe5;
        }
      }
    }
    else if (err != (string *)0x0) {
      __lhs = "File read error. Maybe empty file or invalid file : ";
      goto LAB_0018efe5;
    }
  }
  else if (err != (string *)0x0) {
    __lhs = "File open error : ";
LAB_0018efe5:
    std::operator+(&local_318,__lhs,filepath);
LAB_0018effc:
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_318);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_328 = *plVar3;
      lStack_320 = plVar2[3];
      local_338 = &local_328;
    }
    else {
      local_328 = *plVar3;
      local_338 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)err,(ulong)local_338);
    if (local_338 != &local_328) {
      operator_delete(local_338,local_328 + 1);
    }
    local_278.field_2._M_allocated_capacity = local_318.field_2._M_allocated_capacity;
    local_278._M_dataplus._M_p = local_318._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
LAB_0018f083:
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
  }
  bVar5 = false;
LAB_0018f08d:
  std::ifstream::~ifstream(local_238);
  return bVar5;
}

Assistant:

bool ReadWholeFile(std::vector<uint8_t> *out, std::string *err,
                   const std::string &filepath, size_t filesize_max,
                   void *userdata) {
  (void)userdata;

#ifdef TINYUSDZ_ANDROID_LOAD_FROM_ASSETS
  if (tinyusdz::io::asset_manager) {
    AAsset *asset = AAssetManager_open(asset_manager, filepath.c_str(),
                                       AASSET_MODE_STREAMING);
    if (!asset) {
      if (err) {
        (*err) += "File open error(from AssestManager) : " + filepath + "\n";
      }
      return false;
    }
    off_t len = AAsset_getLength(asset);
    if (len <= 0) {
      if (err) {
        (*err) += "Invalid file size : " + filepath +
                  " (does the path point to a directory?)";
      }
      return false;
    }
    size_t size = size_t(len);

    if (size >= filesize_max) {
      (*err) += "File size exceeds filesize_max : " + filepath +
                " (filesize_max " + std::to_string(filesize_max) + ")";

      return false;
    }

    out->resize(size);
    AAsset_read(asset, reinterpret_cast<char *>(&out->at(0)), size);
    AAsset_close(asset);
    return true;
  } else {
    if (err) {
      (*err) += "No asset manager specified : " + filepath + "\n";
    }
    return false;
  }

#else
#ifdef _WIN32
#if defined(__GLIBCXX__)  // mingw
  int file_descriptor =
      _wopen(UTF8ToWchar(filepath).c_str(), _O_RDONLY | _O_BINARY);
  __gnu_cxx::stdio_filebuf<char> wfile_buf(file_descriptor, std::ios_base::in);
  std::istream f(&wfile_buf);
#elif defined(_MSC_VER) || defined(_LIBCPP_VERSION)
  // For libcxx, assume _LIBCPP_HAS_OPEN_WITH_WCHAR is defined to accept
  // `wchar_t *`
  std::ifstream f(UTF8ToWchar(filepath).c_str(), std::ifstream::binary);
#else
  // Unknown compiler/runtime
  std::ifstream f(filepath.c_str(), std::ifstream::binary);
#endif
#else
  std::ifstream f(filepath.c_str(), std::ifstream::binary);
#endif
  if (!f) {
    if (err) {
      (*err) += "File open error : " + filepath + "\n";
    }
    return false;
  }

  // For directory(and pipe?), peek() will fail(Posix gnustl/libc++ only)
  int buf = f.peek();
  (void)buf;
  if (!f) {
    if (err) {
      (*err) +=
          "File read error. Maybe empty file or invalid file : " + filepath +
          "\n";
    }
    return false;
  }

  f.seekg(0, f.end);
  size_t sz = static_cast<size_t>(f.tellg());
  f.seekg(0, f.beg);

  if (int64_t(sz) < 0) {
    if (err) {
      (*err) += "Invalid file size : " + filepath +
                " (does the path point to a directory?)";
    }
    return false;
  } else if (sz == 0) {
    if (err) {
      (*err) += "File is empty : " + filepath + "\n";
    }
    return false;
  } else if (uint64_t(sz) >= uint64_t(std::numeric_limits<int64_t>::max())) {
    // Posixish environment.
    if (err) {
      (*err) += "Invalid File(Pipe or special device?) : " + filepath + "\n";
    }
    return false;
  }

  if ((filesize_max > 0) && (sz > filesize_max)) {
    if (err) {
      (*err) += "File size is too large : " + filepath +
                " sz = " + std::to_string(sz) +
                ", allowed max filesize = " + std::to_string(filesize_max) +
                "\n";
    }
    return false;
  }

  out->resize(sz);
  f.read(reinterpret_cast<char *>(&out->at(0)),
         static_cast<std::streamsize>(sz));

  if (!f) {
    // read failure.
    if (err) {
      (*err) += "Failed to read file: " + filepath + "\n";
    }
    return false;
  }

  return true;
#endif
}